

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

void __thiscall svg::Shape::Shape(Shape *this,Fill *fill,Stroke *stroke)

{
  Stroke *stroke_local;
  Fill *fill_local;
  Shape *this_local;
  
  Serializeable::Serializeable(&this->super_Serializeable);
  (this->super_Serializeable)._vptr_Serializeable = (_func_int **)&PTR__Shape_001f1550;
  Fill::Fill(&this->fill,fill);
  Stroke::Stroke(&this->stroke,stroke);
  return;
}

Assistant:

Shape(Fill const & fill = Fill(), Stroke const & stroke = Stroke())
            : fill(fill), stroke(stroke) { }